

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.c
# Opt level: O3

void resampler_init(void)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  long lVar6;
  float fVar7;
  double dVar8;
  
  dVar8 = 0.0;
  lVar6 = 0;
  do {
    dVar1 = cos(dVar8 * 0.19634954084936207);
    dVar2 = cos(dVar8 * 0.39269908169872414);
    fVar7 = 0.0;
    if ((ABS(dVar8) < 16.0) && (fVar7 = 1.0, 1e-06 <= ABS(dVar8))) {
      dVar3 = sin(dVar8 * 3.141592653589793);
      fVar7 = (float)(dVar3 / (dVar8 * 3.141592653589793));
    }
    *(float *)((long)sinc_lut + lVar6) = fVar7;
    *(float *)((long)window_lut + lVar6) = (float)(dVar1 * 0.5 + 0.40897 + dVar2 * 0.09103);
    dVar8 = dVar8 + 0.0009765625;
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x10004);
  dVar8 = 0.0;
  dVar1 = 0.0009765625;
  lVar6 = 0;
  do {
    dVar2 = dVar8 * dVar8;
    dVar4 = dVar1 * dVar1;
    dVar3 = dVar8 * 0.5;
    dVar5 = dVar1 * 0.5;
    *(float *)((long)cubic_lut + lVar6 + 0x10) = (float)((dVar1 - dVar4 * 0.5) * dVar1 - dVar5);
    *(float *)((long)cubic_lut + lVar6 + 0x14) = (float)((dVar1 * 1.5 + -2.5) * dVar4 + 1.0);
    *(float *)((long)cubic_lut + lVar6 + 0x18) = (float)((2.0 - dVar1 * 1.5) * dVar4 + dVar5);
    *(float *)((long)cubic_lut + lVar6 + 0x1c) = (float)(dVar5 * dVar1 * dVar1 - dVar5 * dVar1);
    *(float *)((long)cubic_lut + lVar6) = (float)((dVar8 - dVar2 * 0.5) * dVar8 - dVar3);
    *(float *)((long)cubic_lut + lVar6 + 4) = (float)((dVar8 * 1.5 + -2.5) * dVar2 + 1.0);
    *(float *)((long)cubic_lut + lVar6 + 8) = (float)((2.0 - dVar8 * 1.5) * dVar2 + dVar3);
    *(float *)((long)cubic_lut + lVar6 + 0xc) = (float)(dVar3 * dVar8 * dVar8 - dVar3 * dVar8);
    dVar8 = dVar8 + 0.001953125;
    dVar1 = dVar1 + 0.001953125;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0x4000);
  lVar6 = cpuid_Version_info(1);
  resampler_has_sse = *(uint *)(lVar6 + 8) >> 0x19 & 1;
  return;
}

Assistant:

void resampler_init(void)
{
    unsigned i;
    double dx = (float)(SINC_WIDTH) / SINC_SAMPLES, x = 0.0;
    for (i = 0; i < SINC_SAMPLES + 1; ++i, x += dx)
    {
        double y = x / SINC_WIDTH;
#if 0
        // Blackman
        float window = 0.42659 - 0.49656 * cos(M_PI + M_PI * y) + 0.076849 * cos(2.0 * M_PI * y);
#elif 1
        // Nuttal 3 term
        double window = 0.40897 + 0.5 * cos(M_PI * y) + 0.09103 * cos(2.0 * M_PI * y);
#elif 0
        // C.R.Helmrich's 2 term window
        float window = 0.79445 * cos(0.5 * M_PI * y) + 0.20555 * cos(1.5 * M_PI * y);
#elif 0
        // Lanczos
        float window = sinc(y);
#endif
        sinc_lut[i] = (float)(fabs(x) < SINC_WIDTH ? sinc(x) : 0.0);
        window_lut[i] = (float)window;
    }
    dx = 1.0 / RESAMPLER_RESOLUTION;
    x = 0.0;
    for (i = 0; i < RESAMPLER_RESOLUTION; ++i, x += dx)
    {
        cubic_lut[i*4]   = (float)(-0.5 * x * x * x +       x * x - 0.5 * x);
        cubic_lut[i*4+1] = (float)( 1.5 * x * x * x - 2.5 * x * x           + 1.0);
        cubic_lut[i*4+2] = (float)(-1.5 * x * x * x + 2.0 * x * x + 0.5 * x);
        cubic_lut[i*4+3] = (float)( 0.5 * x * x * x - 0.5 * x * x);
    }
#ifdef RESAMPLER_SSE
    resampler_has_sse = query_cpu_feature_sse();
#endif
}